

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O1

QPointF __thiscall QGraphicsView::mapToScene(QGraphicsView *this,QPoint *point)

{
  QGraphicsViewPrivate *this_00;
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  long in_FS_OFFSET;
  QPointF QVar4;
  double dStack_70;
  QPointF local_68 [5];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsViewPrivate **)(this + 8);
  dVar2 = (double)(*point).xp.m_i;
  dVar3 = (double)(*point).yp.m_i;
  auVar1._8_4_ = SUB84(dVar3,0);
  auVar1._0_8_ = dVar2;
  auVar1._12_4_ = (int)((ulong)dVar3 >> 0x20);
  if ((this_00->field_0x300 & 0x20) != 0) {
    QGraphicsViewPrivate::updateScroll(this_00);
  }
  dVar2 = (double)this_00->scrollX + dVar2;
  dStack_70 = auVar1._8_8_;
  if ((this_00->field_0x300 & 0x20) != 0) {
    QGraphicsViewPrivate::updateScroll(this_00);
  }
  dStack_70 = (double)this_00->scrollY + dStack_70;
  if ((this_00->field_0x300 & 0x10) == 0) {
    QTransform::inverted((bool *)local_68);
    dVar2 = (double)QTransform::map(local_68);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  QVar4.yp = dStack_70;
  QVar4.xp = dVar2;
  return QVar4;
}

Assistant:

QPointF QGraphicsView::mapToScene(const QPoint &point) const
{
    Q_D(const QGraphicsView);
    QPointF p = point;
    p.rx() += d->horizontalScroll();
    p.ry() += d->verticalScroll();
    return d->identityMatrix ? p : d->matrix.inverted().map(p);
}